

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2udouble(double *valp,char *str,long max)

{
  ParameterError PVar1;
  int *piVar2;
  size_t sVar3;
  double in_XMM0_Qa;
  char *endptr;
  char *local_28;
  
  if (str == (char *)0x0) {
    PVar1 = PARAM_BAD_NUMERIC;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    in_XMM0_Qa = strtod(str,&local_28);
    PVar1 = PARAM_NUMBER_TOO_LARGE;
    if ((*piVar2 != 0x22) && (in_XMM0_Qa <= (double)max)) {
      if (local_28 == str) {
        PVar1 = PARAM_BAD_NUMERIC;
      }
      else {
        sVar3 = strlen(str);
        PVar1 = PARAM_BAD_NUMERIC;
        if (local_28 == str + sVar3) {
          PVar1 = PARAM_OK;
        }
      }
    }
  }
  if ((PVar1 == PARAM_OK) && (PVar1 = PARAM_NEGATIVE_NUMERIC, 0.0 <= in_XMM0_Qa)) {
    *valp = in_XMM0_Qa;
    PVar1 = PARAM_OK;
  }
  return PVar1;
}

Assistant:

ParameterError str2udouble(double *valp, const char *str, long max)
{
  double value;
  ParameterError result = str2double(&value, str, max);
  if(result != PARAM_OK)
    return result;
  if(value < 0)
    return PARAM_NEGATIVE_NUMERIC;

  *valp = value;
  return PARAM_OK;
}